

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationStart
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int iteration)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  int test_count;
  int test_case_count;
  string local_70;
  string local_50;
  Int32 local_2c;
  char *pcStack_28;
  Int32 shard_index;
  char *filter;
  UnitTest *pUStack_18;
  int iteration_local;
  UnitTest *unit_test_local;
  PrettyUnitTestResultPrinter *this_local;
  
  filter._4_4_ = iteration;
  pUStack_18 = unit_test;
  unit_test_local = (UnitTest *)this;
  if (FLAGS_gtest_repeat != 1) {
    printf("\nRepeating all tests (iteration %d) . . .\n\n",(ulong)(iteration + 1));
  }
  pcStack_28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_filter_abi_cxx11_);
  bVar1 = String::CStringEquals(pcStack_28,"*");
  if (!bVar1) {
    ColoredPrintf(COLOR_YELLOW,"Note: %s filter = %s\n","Google Test",pcStack_28);
  }
  bVar1 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",false);
  if (bVar1) {
    local_2c = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
    uVar2 = local_2c + 1;
    pcVar3 = posix::GetEnv("GTEST_TOTAL_SHARDS");
    ColoredPrintf(COLOR_YELLOW,"Note: This is test shard %d of %s.\n",(ulong)uVar2,pcVar3);
  }
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    uVar2 = UnitTest::random_seed(pUStack_18);
    ColoredPrintf(COLOR_YELLOW,"Note: Randomizing tests\' orders with a seed of %d .\n",(ulong)uVar2
                 );
  }
  ColoredPrintf(COLOR_GREEN,"[==========] ");
  uVar2 = UnitTest::test_to_run_count(pUStack_18);
  FormatTestCount_abi_cxx11_(&local_50,(testing *)(ulong)uVar2,test_count);
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_50);
  uVar2 = UnitTest::test_case_to_run_count(pUStack_18);
  FormatTestCaseCount_abi_cxx11_(&local_70,(testing *)(ulong)uVar2,test_case_count);
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_70);
  printf("Running %s from %s.\n",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationStart(
    const UnitTest& unit_test, int iteration) {
  if (GTEST_FLAG(repeat) != 1)
    printf("\nRepeating all tests (iteration %d) . . .\n\n", iteration + 1);

  const char* const filter = GTEST_FLAG(filter).c_str();

  // Prints the filter if it's not *.  This reminds the user that some
  // tests may be skipped.
  if (!String::CStringEquals(filter, kUniversalFilter)) {
    ColoredPrintf(COLOR_YELLOW,
                  "Note: %s filter = %s\n", GTEST_NAME_, filter);
  }

  if (internal::ShouldShard(kTestTotalShards, kTestShardIndex, false)) {
    const Int32 shard_index = Int32FromEnvOrDie(kTestShardIndex, -1);
    ColoredPrintf(COLOR_YELLOW,
                  "Note: This is test shard %d of %s.\n",
                  static_cast<int>(shard_index) + 1,
                  internal::posix::GetEnv(kTestTotalShards));
  }

  if (GTEST_FLAG(shuffle)) {
    ColoredPrintf(COLOR_YELLOW,
                  "Note: Randomizing tests' orders with a seed of %d .\n",
                  unit_test.random_seed());
  }

  ColoredPrintf(COLOR_GREEN,  "[==========] ");
  printf("Running %s from %s.\n",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestCaseCount(unit_test.test_case_to_run_count()).c_str());
  fflush(stdout);
}